

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_obj.h
# Opt level: O3

void * array_realloc(void *ptr,fastObjUInt n,fastObjUInt b)

{
  uint uVar1;
  void *__ptr;
  int *piVar2;
  int iVar3;
  uint uVar4;
  
  if (ptr == (void *)0x0) {
    iVar3 = 0;
    uVar4 = 1;
    uVar1 = 0;
  }
  else {
    iVar3 = *(int *)((long)ptr + -8);
    uVar4 = iVar3 + 1;
    uVar1 = (uint)(*(int *)((long)ptr + -4) * 3) >> 1;
  }
  if (uVar4 < uVar1) {
    uVar4 = uVar1;
  }
  uVar4 = uVar4 + 0xf & 0xfffffff0;
  __ptr = (void *)((long)ptr + -8);
  if (ptr == (void *)0x0) {
    __ptr = (void *)0x0;
  }
  piVar2 = (int *)realloc(__ptr,(ulong)(n * uVar4 | 8));
  if (piVar2 == (int *)0x0) {
    piVar2 = (int *)0x0;
  }
  else {
    *piVar2 = iVar3;
    piVar2[1] = uVar4;
    piVar2 = piVar2 + 2;
  }
  return piVar2;
}

Assistant:

static void* array_realloc(void* ptr, fastObjUInt n, fastObjUInt b)
{
   fastObjUInt sz = array_size(ptr);
   fastObjUInt nsz = sz + n;
   fastObjUInt cap = array_capacity(ptr);
   fastObjUInt ncap = 3 * cap / 2;
   fastObjUInt* r;


   if (ncap < nsz)
       ncap = nsz;
   ncap = (ncap + 15) & ~15u;

   r = (fastObjUInt*)(memory_realloc(ptr ? _array_header(ptr) : 0, b * ncap + 2 * sizeof(fastObjUInt)));
   if (!r)
       return 0;

   r[0] = sz;
   r[1] = ncap;

   return (r + 2);
}